

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_memory.c
# Opt level: O0

void * resizebytes(void *old,size_t oldsize,size_t newsize)

{
  void *pvVar1;
  void *ret;
  size_t newsize_local;
  size_t oldsize_local;
  void *old_local;
  
  ret = (void *)newsize;
  if (newsize == 0) {
    ret = &DAT_00000001;
  }
  newsize_local = oldsize;
  if (oldsize == 0) {
    newsize_local = 1;
  }
  pvVar1 = realloc(old,(size_t)ret);
  if ((newsize_local < ret) && (pvVar1 != (void *)0x0)) {
    memset((void *)((long)pvVar1 + newsize_local),0,(long)ret - newsize_local);
  }
  if (pvVar1 == (void *)0x0) {
    post("pd: resizebytes() failed -- out of memory");
  }
  return pvVar1;
}

Assistant:

void *resizebytes(void *old, size_t oldsize, size_t newsize)
{
    void *ret;
    if (newsize < 1) newsize = 1;
    if (oldsize < 1) oldsize = 1;
    ret = (void *)realloc((char *)old, newsize);
    if (newsize > oldsize && ret)
        memset(((char *)ret) + oldsize, 0, newsize - oldsize);
#ifdef LOUD
    fprintf(stderr, "resize %lx %d --> %lx %d\n", (int)old, oldsize, (int)ret, newsize);
#endif /* LOUD */
#ifdef DEBUGMEM
    totalmem += (newsize - oldsize);
#endif
    if (!ret)
        post("pd: resizebytes() failed -- out of memory");
    return (ret);
}